

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

bool __thiscall
slang::ast::Bitstream::canBeTarget
          (Bitstream *this,StreamingConcatenationExpression *lhs,Expression *rhs,
          SourceRange assignmentRange,ASTContext *context)

{
  pointer pcVar1;
  bool bVar2;
  Diagnostic *pDVar3;
  Diagnostic *this_00;
  SourceLocation SVar4;
  SourceLocation SVar5;
  SourceRange sourceRange;
  SourceRange range;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange *with;
  SourceRange *dynamic;
  pointer local_88;
  SourceRange *local_80;
  SourceRange *local_78;
  string local_70;
  string local_50;
  
  SVar5 = assignmentRange.endLoc;
  sourceRange_00.endLoc = assignmentRange.startLoc;
  if ((lhs->super_Expression).kind != Streaming) {
    SVar4 = SVar5;
    bVar2 = Type::isBitstreamType((lhs->super_Expression).type.ptr,false);
    if (!bVar2) {
      sourceRange_00.startLoc = (SourceLocation)rhs;
      pDVar3 = ASTContext::addDiag((ASTContext *)SVar5,(DiagCode)0x2e0007,sourceRange_00);
      pDVar3 = ast::operator<<(pDVar3,(lhs->super_Expression).type.ptr);
      SVar5 = *(SourceLocation *)(this + 0x20);
      SVar4 = *(SourceLocation *)(this + 0x28);
      goto LAB_003cc52a;
    }
    sourceRange.endLoc = SVar4;
    sourceRange.startLoc = (lhs->super_Expression).sourceRange.endLoc;
    bVar2 = checkClassAccess((Bitstream *)(lhs->super_Expression).type.ptr,(Type *)SVar5,
                             (ASTContext *)(lhs->super_Expression).sourceRange.startLoc,sourceRange)
    ;
    if (!bVar2) {
      return false;
    }
  }
  local_78 = (SourceRange *)0x0;
  local_80 = (SourceRange *)0x0;
  bVar2 = withAfterDynamic((StreamingConcatenationExpression *)this,&local_78,&local_80);
  if (!bVar2) {
    if ((*(byte *)((long)SVar5 + 0x10) & 2) != 0) {
      return true;
    }
    pcVar1 = *(pointer *)(this + 0x48);
    if ((lhs->super_Expression).kind == Streaming) {
      local_88 = (pointer)lhs->bitstreamWidth;
      bVar2 = StreamingConcatenationExpression::isFixedSize
                        ((StreamingConcatenationExpression *)this);
      if ((bVar2) && (bVar2 = StreamingConcatenationExpression::isFixedSize(lhs), bVar2)) {
        bVar2 = pcVar1 == local_88;
      }
      else {
        bVar2 = dynamicSizesMatch<slang::ast::StreamingConcatenationExpression,slang::ast::StreamingConcatenationExpression>
                          ((StreamingConcatenationExpression *)this,lhs);
      }
    }
    else {
      bVar2 = Type::isFixedSize((lhs->super_Expression).type.ptr);
      if (!bVar2) {
        return true;
      }
      local_88 = (pointer)Type::getBitstreamWidth((lhs->super_Expression).type.ptr);
      bVar2 = pcVar1 <= local_88;
    }
    if (bVar2 == false) {
      sourceRange_01.endLoc = sourceRange_00.endLoc;
      sourceRange_01.startLoc = (SourceLocation)rhs;
      pDVar3 = ASTContext::addDiag((ASTContext *)SVar5,(DiagCode)0x2c0007,sourceRange_01);
      if ((lhs->super_Expression).kind == Streaming) {
        formatWidth<slang::ast::StreamingConcatenationExpression>
                  (&local_70,(StreamingConcatenationExpression *)this,DestFill);
        this_00 = Diagnostic::operator<<(pDVar3,&local_70);
        formatWidth<slang::ast::StreamingConcatenationExpression>(&local_50,lhs,Source);
        Diagnostic::operator<<(this_00,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_70._M_dataplus._M_p = pcVar1;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar3->args,(unsigned_long *)&local_70);
        local_70._M_dataplus._M_p = local_88;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar3->args,(unsigned_long *)&local_70);
      }
      Diagnostic::operator<<(pDVar3,*(SourceRange *)(this + 0x20));
      if ((lhs->super_Expression).kind == Streaming) {
        Diagnostic::operator<<(pDVar3,(lhs->super_Expression).sourceRange);
        return false;
      }
      return false;
    }
    return bVar2;
  }
  pDVar3 = ASTContext::addDiag((ASTContext *)SVar5,(DiagCode)0x300007,*local_80);
  SVar5 = local_78->startLoc;
  SVar4 = local_78->endLoc;
LAB_003cc52a:
  range.endLoc = SVar4;
  range.startLoc = SVar5;
  Diagnostic::operator<<(pDVar3,range);
  return false;
}

Assistant:

bool Bitstream::canBeTarget(const StreamingConcatenationExpression& lhs, const Expression& rhs,
                            SourceRange assignmentRange, const ASTContext& context) {
    if (rhs.kind != ExpressionKind::Streaming) {
        if (!rhs.type->isBitstreamType()) {
            context.addDiag(diag::BadStreamSourceType, assignmentRange)
                << *rhs.type << lhs.sourceRange;
            return false;
        }

        if (!checkClassAccess(*rhs.type, context, rhs.sourceRange))
            return false;
    }

    const SourceRange *dynamic = nullptr, *with = nullptr;
    if (withAfterDynamic(lhs, dynamic, with)) {
        context.addDiag(diag::BadStreamWithOrder, *with) << *dynamic;
        return false;
    }

    if (context.inUnevaluatedBranch())
        return true; // No size check in an unevaluated conditional branch

    uint64_t targetWidth = lhs.getBitstreamWidth();
    uint64_t sourceWidth;
    bool good = true;

    if (rhs.kind != ExpressionKind::Streaming) {
        if (!rhs.type->isFixedSize())
            return true; // Sizes checked at constant evaluation or runtime

        sourceWidth = rhs.type->getBitstreamWidth();
        good = targetWidth <= sourceWidth;
    }
    else {
        auto& source = rhs.as<StreamingConcatenationExpression>();
        sourceWidth = source.getBitstreamWidth();
        if (lhs.isFixedSize() && source.isFixedSize())
            good = targetWidth == sourceWidth;
        else
            good = dynamicSizesMatch(lhs, source);
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadStreamSize, assignmentRange);
        if (rhs.kind != ExpressionKind::Streaming)
            diag << targetWidth << sourceWidth;
        else {
            diag << formatWidth(lhs, BitstreamSizeMode::DestFill)
                 << formatWidth(rhs.as<StreamingConcatenationExpression>(),
                                BitstreamSizeMode::Source);
        }

        diag << lhs.sourceRange;
        if (rhs.kind == ExpressionKind::Streaming)
            diag << rhs.sourceRange;
    }

    return good;
}